

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanLogicalDevice::~VulkanLogicalDevice(VulkanLogicalDevice *this)

{
  (*vkDestroyDevice)(this->m_VkDevice,this->m_VkAllocator);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_SupportedAccessMask).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_SupportedStagesMask).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<VulkanUtilities::VulkanLogicalDevice>).
              _M_weak_this.
              super___weak_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

VulkanLogicalDevice::~VulkanLogicalDevice()
{
    vkDestroyDevice(m_VkDevice, m_VkAllocator);
}